

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.c
# Opt level: O0

void state_reset(apx_vm_writeState_t *self,dtl_dv_type_id type_id)

{
  dtl_dv_type_id type_id_local;
  apx_vm_writeState_t *self_local;
  
  if (self != (apx_vm_writeState_t *)0x0) {
    self->value_type = type_id;
    adt_str_clear(&self->field_name);
    self->index = 0;
    self->array_len = 0;
    self->max_array_len = 0;
    self->element_size = 0;
    self->is_last_field = false;
    self->type_code = '\0';
    self->scalar_storage_type = '\0';
    self->range_check_state = '\0';
    self->dynamic_size_type = '\0';
    (self->scalar_value).i32 = 0;
    return;
  }
  __assert_fail("self != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/serializer.c"
                ,0x39b,"void state_reset(apx_vm_writeState_t *, dtl_dv_type_id)");
}

Assistant:

static void state_reset(apx_vm_writeState_t* self, dtl_dv_type_id type_id)
{
   assert(self != NULL);
   self->value_type = type_id;
   adt_str_clear(&self->field_name);
   self->index = 0u;
   self->array_len = 0u;
   self->max_array_len = 0u;
   self->element_size = 0u;
   self->is_last_field = false;
   self->type_code = APX_TYPE_CODE_NONE;
   self->scalar_storage_type = APX_VM_SCALAR_STORAGE_TYPE_NONE;
   self->range_check_state = APX_RANGE_CHECK_STATE_NOT_CHECKED;
   self->dynamic_size_type = APX_SIZE_TYPE_NONE;
   self->scalar_value.i32 = 0u;
}